

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# metadata_encoder.cc
# Opt level: O0

bool __thiscall
draco::MetadataEncoder::EncodeString(MetadataEncoder *this,EncoderBuffer *out_buffer,string *str)

{
  undefined1 uVar1;
  ulong uVar2;
  uchar *in_RDX;
  EncoderBuffer *in_RSI;
  undefined6 in_stack_ffffffffffffffd8;
  undefined1 in_stack_ffffffffffffffdf;
  undefined1 local_1;
  
  uVar2 = std::__cxx11::string::size();
  if (uVar2 < 0x100) {
    uVar2 = std::__cxx11::string::empty();
    if ((uVar2 & 1) == 0) {
      uVar1 = std::__cxx11::string::size();
      EncoderBuffer::Encode<unsigned_char>(in_RSI,in_RDX);
      std::__cxx11::string::c_str();
      std::__cxx11::string::size();
      EncoderBuffer::Encode
                (in_RSI,in_RDX,
                 CONCAT17(in_stack_ffffffffffffffdf,CONCAT16(uVar1,in_stack_ffffffffffffffd8)));
    }
    else {
      EncoderBuffer::Encode<unsigned_char>(in_RSI,in_RDX);
    }
    local_1 = true;
  }
  else {
    local_1 = false;
  }
  return local_1;
}

Assistant:

bool MetadataEncoder::EncodeString(EncoderBuffer *out_buffer,
                                   const std::string &str) {
  // We only support string of maximum length 255 which is using one byte to
  // encode the length.
  if (str.size() > 255) {
    return false;
  }
  if (str.empty()) {
    out_buffer->Encode(static_cast<uint8_t>(0));
  } else {
    out_buffer->Encode(static_cast<uint8_t>(str.size()));
    out_buffer->Encode(str.c_str(), str.size());
  }
  return true;
}